

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFExporter.cpp
# Opt level: O2

bool FindMeshNode(Ref<glTF::Node> *nodeIn,Ref<glTF::Node> *meshNode,string *meshID)

{
  Node *pNVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  string local_50;
  
  uVar6 = 0;
  do {
    pNVar1 = (nodeIn->vector->super__Vector_base<glTF::Node_*,_std::allocator<glTF::Node_*>_>).
             _M_impl.super__Vector_impl_data._M_start[nodeIn->index];
    if ((ulong)((long)*(pointer *)
                       ((long)&(pNVar1->meshes).
                               super__Vector_base<glTF::Ref<glTF::Mesh>,_std::allocator<glTF::Ref<glTF::Mesh>_>_>
                       + 8) -
                *(long *)&(pNVar1->meshes).
                          super__Vector_base<glTF::Ref<glTF::Mesh>,_std::allocator<glTF::Ref<glTF::Mesh>_>_>
                          ._M_impl >> 4) <= (ulong)uVar6) {
      uVar6 = 0;
      do {
        uVar7 = (ulong)uVar6;
        pNVar1 = (nodeIn->vector->super__Vector_base<glTF::Node_*,_std::allocator<glTF::Node_*>_>).
                 _M_impl.super__Vector_impl_data._M_start[nodeIn->index];
        lVar2 = *(long *)&(pNVar1->children).
                          super__Vector_base<glTF::Ref<glTF::Node>,_std::allocator<glTF::Ref<glTF::Node>_>_>
                          ._M_impl;
        uVar5 = (long)*(pointer *)
                       ((long)&(pNVar1->children).
                               super__Vector_base<glTF::Ref<glTF::Node>,_std::allocator<glTF::Ref<glTF::Node>_>_>
                       + 8) - lVar2 >> 4;
        if (uVar5 <= uVar7) {
          return uVar7 < uVar5;
        }
        std::__cxx11::string::string((string *)&local_50,(string *)meshID);
        bVar3 = FindMeshNode((Ref<glTF::Node> *)(lVar2 + uVar7 * 0x10),meshNode,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        uVar6 = uVar6 + 1;
      } while (!bVar3);
      return uVar7 < uVar5;
    }
    iVar4 = std::__cxx11::string::compare((string *)meshID);
    uVar6 = uVar6 + 1;
  } while (iVar4 != 0);
  meshNode->index = nodeIn->index;
  meshNode->vector = nodeIn->vector;
  return true;
}

Assistant:

bool FindMeshNode(Ref<Node>& nodeIn, Ref<Node>& meshNode, std::string meshID)
{
    for (unsigned int i = 0; i < nodeIn->meshes.size(); ++i) {
        if (meshID.compare(nodeIn->meshes[i]->id) == 0) {
          meshNode = nodeIn;
          return true;
        }
    }

    for (unsigned int i = 0; i < nodeIn->children.size(); ++i) {
        if(FindMeshNode(nodeIn->children[i], meshNode, meshID)) {
          return true;
        }
    }

    return false;
}